

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l5.c
# Opt level: O0

int picnic3_l5_sign(picnic3_l5_privatekey_t *sk,uint8_t *message,size_t message_len,
                   uint8_t *signature,size_t *signature_len)

{
  picnic_instance_t *ppVar1;
  long in_RCX;
  long in_RDI;
  long in_R8;
  size_t in_stack_00000008;
  uint8_t *in_stack_00000010;
  uint8_t *sk_pt;
  uint8_t *sk_c;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_4 = -1;
  }
  else {
    ppVar1 = picnic_instance_get(Picnic3_L5);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = impl_sign_picnic3(instance,sk_sk,sk_c,sk_pt,in_stack_00000010,in_stack_00000008,
                                  signature,(size_t *)message_len);
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l5_sign(const picnic3_l5_privatekey_t* sk,
                                                const uint8_t* message, size_t message_len,
                                                uint8_t* signature, size_t* signature_len) {
  if (!sk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* sk_pt = SK_PT(sk);

  return impl_sign_picnic3(instance, sk_pt, sk_sk, sk_c, message, message_len, signature,
                             signature_len);
}